

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

bool hands_full(CHAR_DATA *ch)

{
  OBJ_DATA *pOVar1;
  CHAR_DATA *in_RDI;
  int *unaff_retaddr;
  CLogger *in_stack_00000008;
  string_view in_stack_00000010;
  int count;
  OBJ_DATA *weapon;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  bool local_1;
  
  iVar2 = 0;
  pOVar1 = get_eq_char(in_RDI,0);
  if (pOVar1 != (OBJ_DATA *)0x0) {
    iVar2 = iVar2 + 1;
  }
  pOVar1 = get_eq_char(in_RDI,0x10);
  if (pOVar1 != (OBJ_DATA *)0x0) {
    iVar2 = iVar2 + 1;
  }
  pOVar1 = get_eq_char(in_RDI,0x11);
  if (pOVar1 != (OBJ_DATA *)0x0) {
    iVar2 = iVar2 + 1;
  }
  pOVar1 = get_eq_char(in_RDI,0xb);
  if (pOVar1 != (OBJ_DATA *)0x0) {
    iVar2 = iVar2 + 1;
  }
  pOVar1 = get_eq_char(in_RDI,0x12);
  if (pOVar1 != (OBJ_DATA *)0x0) {
    iVar2 = iVar2 + 1;
  }
  pOVar1 = get_eq_char(in_RDI,0x10);
  if ((pOVar1 != (OBJ_DATA *)0x0) &&
     (((pOVar1->value[0] == 9 || (pOVar1->value[0] == 8)) || (pOVar1->value[0] == 3)))) {
    iVar2 = iVar2 + 1;
  }
  iVar2 = iVar2 - (in_RDI->arms + -2);
  if (iVar2 < 2) {
    local_1 = false;
  }
  else {
    if (2 < iVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      CLogger::Warn<int&>(in_stack_00000008,in_stack_00000010,unaff_retaddr);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool hands_full(CHAR_DATA *ch)
{
	OBJ_DATA *weapon;
	int count;

	count = 0;

	if (get_eq_char(ch, WEAR_LIGHT) != nullptr)
		count++;

	if (get_eq_char(ch, WEAR_WIELD) != nullptr)
		count++;

	if (get_eq_char(ch, WEAR_HOLD) != nullptr)
		count++;

	if (get_eq_char(ch, WEAR_SHIELD) != nullptr)
		count++;

	if (get_eq_char(ch, WEAR_DUAL_WIELD) != nullptr)
		count++;

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon != nullptr
		&& (weapon->value[0] == WEAPON_STAFF || weapon->value[0] == WEAPON_POLEARM || weapon->value[0] == WEAPON_SPEAR))
	{
		count++;
	}

	count -= ch->arms - 2;

	if (count < 2)
		return false;

	if (count > 2)
		RS.Logger.Warn("Hands full: Character holding {} items.", count);

	return true;
}